

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_out_scope.cpp
# Opt level: O3

void __thiscall A::A(A *this,A *other)

{
  char *__s;
  float *pfVar1;
  spin_mutex_t sVar2;
  float *pfVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  this->n_ = other->n_;
  lVar5 = (long)other->n_ * (long)other->n_;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (int)lVar5) {
    uVar7 = lVar5 * 4;
  }
  pfVar3 = (float *)operator_new__(uVar7);
  this->c = pfVar3;
  this->name_ = other->name_;
  do {
    sVar2.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar2.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Copying ",8);
  __s = this->name_;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x115230);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  if (0 < this->n_) {
    pfVar3 = other->c;
    pfVar1 = this->c;
    iVar6 = 0;
    do {
      if (0 < this->n_) {
        lVar5 = 0;
        do {
          pfVar1[(long)this->n_ * (long)iVar6 + lVar5] =
               pfVar3[(long)this->n_ * (long)iVar6 + lVar5];
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < this->n_);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->n_);
  }
  return;
}

Assistant:

A(const A& other) 
  : n_(other.n_), c(new float[other.n_ * other.n_]), name_(other.name_)
  {
    LOG("Copying " << name_);
    for(int i = 0; i < n_; i++)
      for(int j = 0; j < n_; j++) {
	c[i*n_+j] = other.c[i*n_+j];
      }
  }